

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress_fragment.c
# Opt level: O3

void BrotliCompressFragmentFastImpl11
               (MemoryManager *m,uint8_t *input,size_t input_size,int is_last,int *table,
               uint8_t *cmd_depth,uint16_t *cmd_bits,size_t *cmd_code_numbits,uint8_t *cmd_code,
               size_t *storage_ix,uint8_t *storage)

{
  dword *pdVar1;
  long *data;
  uint8_t *puVar2;
  byte bVar3;
  byte bVar4;
  int iVar5;
  ushort *puVar6;
  uint uVar7;
  uint uVar8;
  size_t j;
  long *begin;
  long *plVar9;
  long *plVar10;
  uint8_t *puVar11;
  uint32_t *puVar12;
  byte *pbVar13;
  byte bVar14;
  ulong uVar15;
  dword *pdVar16;
  long *plVar17;
  uint8_t *puVar18;
  ulong uVar19;
  Elf64_Ehdr *array;
  ulong uVar20;
  size_t storage_ix_start;
  uint8_t *puVar21;
  int iVar22;
  int iVar23;
  ulong uVar24;
  long lVar25;
  ulong uVar26;
  long *plVar27;
  long *plVar28;
  long *plVar29;
  int iVar30;
  uint8_t *base_ip;
  ulong uVar31;
  bool bVar32;
  uint32_t cmd_histo [128];
  uint8_t lit_depth [256];
  uint16_t lit_bits [256];
  Elf64_Ehdr *local_5b0;
  Elf64_Ehdr *local_5a8;
  Elf64_Ehdr *local_5a0;
  ulong local_590;
  uint32_t local_538 [19];
  uint32_t auStack_4ec [11];
  int aiStack_4c0 [9];
  uint32_t local_49c;
  uint32_t auStack_498 [21];
  uint32_t local_444;
  uint32_t local_440 [18];
  int aiStack_3f8 [48];
  byte local_338 [256];
  uint16_t local_238 [260];
  
  local_5a8 = (Elf64_Ehdr *)0x18000;
  if (input_size < 0x18000) {
    local_5a8 = (Elf64_Ehdr *)input_size;
  }
  storage_ix_start = *storage_ix;
  BrotliStoreMetaBlockHeader((size_t)local_5a8,0,storage_ix,storage);
  uVar24 = *storage_ix;
  uVar15 = uVar24 >> 3;
  *(ulong *)(storage + uVar15) = (ulong)storage[uVar15];
  *storage_ix = uVar24 + 0xd;
  local_590 = BuildAndStoreLiteralPrefixCode
                        (m,input,(size_t)local_5a8,local_338,local_238,storage_ix,storage);
  uVar24 = *cmd_code_numbits;
  uVar15 = *storage_ix;
  if (7 < uVar24) {
    uVar19 = 0;
    do {
      *(ulong *)(storage + (uVar15 >> 3)) =
           (ulong)cmd_code[uVar19 >> 3] << ((byte)uVar15 & 7) | (ulong)storage[uVar15 >> 3];
      uVar15 = uVar15 + 8;
      *storage_ix = uVar15;
      uVar24 = *cmd_code_numbits;
      uVar20 = uVar19 + 0xf;
      uVar19 = uVar19 + 8;
    } while (uVar20 < uVar24);
  }
  *(ulong *)(storage + (uVar15 >> 3)) =
       (ulong)cmd_code[uVar24 >> 3] << ((byte)uVar15 & 7) | (ulong)storage[uVar15 >> 3];
  *storage_ix = ((uint)uVar24 & 7) + uVar15;
  begin = (long *)input;
  local_5b0 = (Elf64_Ehdr *)input_size;
LAB_00130e01:
  plVar29 = begin;
  plVar27 = begin;
  local_5a0 = local_5a8;
  do {
    memcpy(local_538,kCmdHistoSeed,0x200);
    data = (long *)((long)plVar27 + (long)local_5a0);
    if ((Elf64_Ehdr *)0xf < local_5a0) {
      pdVar1 = (dword *)((long)&local_5a0[-1].e_shentsize + 1);
      pdVar16 = &local_5b0[-1].e_flags;
      if (pdVar1 < &local_5b0[-1].e_flags) {
        pdVar16 = pdVar1;
      }
      if (1 < (long)pdVar16) {
        plVar17 = (long *)((long)pdVar16 + (long)plVar27);
        plVar10 = (long *)((long)plVar27 + 2);
        iVar23 = -1;
        plVar28 = plVar27;
LAB_00130e98:
        lVar25 = *(long *)((long)plVar28 + 1);
        uVar8 = 0x21;
        plVar28 = (long *)((long)plVar28 + 1);
        do {
          plVar9 = plVar10;
          uVar24 = (ulong)(lVar25 * 0x1e35a7bd000000) >> 0x35;
          lVar25 = *plVar9;
          iVar30 = (int)input;
          if ((((int)*plVar28 == *(int *)((long)plVar28 + -(long)iVar23)) &&
              (puVar11 = (uint8_t *)((long)plVar28 + -(long)iVar23),
              *(uint8_t *)((long)plVar28 + 4) == puVar11[4])) && (0 < iVar23)) {
            table[uVar24] = (int)plVar28 - iVar30;
LAB_00130ee5:
            if ((long)plVar28 - (long)puVar11 < 0x3fff1) goto LAB_00130f3d;
          }
          else {
            iVar22 = table[uVar24];
            table[uVar24] = (int)plVar28 - iVar30;
            if (((int)*plVar28 == *(int *)(input + iVar22)) &&
               (puVar11 = input + iVar22, *(uint8_t *)((long)plVar28 + 4) == puVar11[4]))
            goto LAB_00130ee5;
          }
          plVar10 = (long *)((ulong)(uVar8 >> 5) + (long)plVar9);
          if (plVar17 < plVar10) break;
          uVar8 = uVar8 + 1;
          plVar28 = plVar9;
        } while( true );
      }
    }
LAB_00131d13:
    local_5b0 = (Elf64_Ehdr *)((long)local_5b0 - (long)local_5a0);
    local_5a0 = (Elf64_Ehdr *)0x10000;
    if (local_5b0 < (Elf64_Ehdr *)0x10000) {
      local_5a0 = local_5b0;
    }
    if (((local_5b0 == (Elf64_Ehdr *)0x0) ||
        (local_5a8 = (Elf64_Ehdr *)
                     (local_5a0->e_ident_magic_str + (long)(local_5a8->e_ident_magic_str + -2)),
        &Elf64_Ehdr_00100000 < local_5a8)) ||
       (array = local_5a0, iVar23 = ShouldMergeBlock((uint8_t *)data,(size_t)local_5a0,local_338),
       iVar23 == 0)) goto LAB_00131da6;
    UpdateBits((ulong)((int)local_5a8 - 1),(int)storage_ix_start + 3,(size_t)storage,
               &array->e_ident_magic_num);
    plVar27 = data;
  } while( true );
LAB_00130f3d:
  puVar2 = (uint8_t *)((long)plVar28 + 5);
  puVar18 = (uint8_t *)((long)data + (-5 - (long)plVar28));
  if ((uint8_t *)0x7 < puVar18) {
    uVar24 = (ulong)puVar18 & 0xfffffffffffffff8;
    puVar21 = puVar2 + uVar24;
    lVar25 = 0;
    uVar15 = 0;
LAB_00130f78:
    if (*(ulong *)(puVar2 + uVar15 * 8) == *(ulong *)(puVar11 + uVar15 * 8 + 5))
    goto code_r0x00130f86;
    uVar15 = *(ulong *)(puVar11 + uVar15 * 8 + 5) ^ *(ulong *)(puVar2 + uVar15 * 8);
    uVar24 = 0;
    if (uVar15 != 0) {
      for (; (uVar15 >> uVar24 & 1) == 0; uVar24 = uVar24 + 1) {
      }
    }
    uVar15 = (uVar24 >> 3 & 0x1fffffff) - lVar25;
    goto LAB_00130fbf;
  }
  uVar24 = 0;
  puVar21 = puVar2;
LAB_00131ba9:
  uVar19 = (ulong)puVar18 & 7;
  uVar15 = uVar24;
  if (uVar19 != 0) {
    uVar20 = uVar24 | uVar19;
    do {
      uVar15 = uVar24;
      if (puVar11[uVar24 + 5] != *puVar21) break;
      puVar21 = puVar21 + 1;
      uVar24 = uVar24 + 1;
      uVar19 = uVar19 - 1;
      uVar15 = uVar20;
    } while (uVar19 != 0);
  }
LAB_00130fbf:
  uVar24 = (long)plVar28 - (long)plVar29;
  if (uVar24 < 0x1842) {
    if (uVar24 < 6) {
      uVar19 = *storage_ix;
      uVar26 = cmd_depth[uVar24 + 0x28] + uVar19;
      *(ulong *)(storage + (uVar19 >> 3)) =
           (ulong)cmd_bits[uVar24 + 0x28] << ((byte)uVar19 & 7) | (ulong)storage[uVar19 >> 3];
      *storage_ix = uVar26;
      puVar12 = auStack_498 + uVar24;
    }
    else if (uVar24 < 0x82) {
      uVar19 = uVar24 - 2;
      uVar8 = 0x1f;
      if ((uint)uVar19 != 0) {
        for (; (uint)uVar19 >> uVar8 == 0; uVar8 = uVar8 - 1) {
        }
      }
      uVar8 = (uVar8 ^ 0xffffffe0) + 0x1f;
      uVar31 = uVar19 >> ((byte)uVar8 & 0x3f);
      lVar25 = uVar31 + (ulong)uVar8 * 2;
      uVar20 = *storage_ix;
      uVar26 = cmd_depth[lVar25 + 0x2a] + uVar20;
      *(ulong *)(storage + (uVar20 >> 3)) =
           (ulong)cmd_bits[lVar25 + 0x2a] << ((byte)uVar20 & 7) | (ulong)storage[uVar20 >> 3];
      *storage_ix = uVar26;
      *(ulong *)(storage + (uVar26 >> 3)) =
           uVar19 - (uVar31 << ((byte)uVar8 & 0x3f)) << ((byte)uVar26 & 7) |
           (ulong)storage[uVar26 >> 3];
      uVar26 = uVar26 + uVar8;
      *storage_ix = uVar26;
      puVar12 = auStack_498 + lVar25 + 2;
    }
    else if (uVar24 < 0x842) {
      uVar7 = (int)uVar24 - 0x42;
      uVar8 = 0x1f;
      if (uVar7 != 0) {
        for (; uVar7 >> uVar8 == 0; uVar8 = uVar8 - 1) {
        }
      }
      lVar25 = 0x51 - (ulong)(uVar8 ^ 0x1f);
      uVar19 = *storage_ix;
      uVar20 = cmd_depth[lVar25] + uVar19;
      *(ulong *)(storage + (uVar19 >> 3)) =
           (ulong)cmd_bits[lVar25] << ((byte)uVar19 & 7) | (ulong)storage[uVar19 >> 3];
      *storage_ix = uVar20;
      uVar26 = uVar8 + uVar20;
      *(ulong *)(storage + (uVar20 >> 3)) =
           (-1L << ((byte)uVar8 & 0x3f)) + uVar24 + -0x42 << ((byte)uVar20 & 7) |
           (ulong)storage[uVar20 >> 3];
      *storage_ix = uVar26;
      puVar12 = local_538 + lVar25;
    }
    else {
      uVar20 = *storage_ix;
      uVar19 = uVar20 + cmd_depth[0x3d];
      uVar26 = cmd_depth[0x3d] + uVar20 + 0xc;
      *(ulong *)(storage + (uVar20 >> 3)) =
           (ulong)cmd_bits[0x3d] << ((byte)uVar20 & 7) | (ulong)storage[uVar20 >> 3];
      *storage_ix = uVar19;
      *(ulong *)(storage + (uVar19 >> 3)) =
           uVar24 - 0x842 << ((byte)uVar19 & 7) | (ulong)storage[uVar19 >> 3];
      *storage_ix = uVar26;
      puVar12 = &local_444;
    }
  }
  else {
    uVar19 = ((long)plVar29 - (long)begin) * 0x32;
    if ((uVar19 < uVar24 || uVar19 - uVar24 == 0) && (0x3d4 < local_590)) {
      EmitUncompressedMetaBlock
                ((uint8_t *)begin,(uint8_t *)plVar28,storage_ix_start,storage_ix,storage);
      local_5b0 = (Elf64_Ehdr *)
                  ((long)plVar27 + (long)(local_5b0->e_ident_magic_str + (-1 - (long)plVar28)));
      goto LAB_0013203e;
    }
    if (uVar24 < 0x5842) {
      uVar26 = (ulong)cmd_depth[0x3e];
      uVar20 = *storage_ix;
      uVar19 = uVar20 + uVar26;
      uVar26 = uVar26 + uVar20 + 0xe;
      *(ulong *)(storage + (uVar20 >> 3)) =
           (ulong)cmd_bits[0x3e] << ((byte)uVar20 & 7) | (ulong)storage[uVar20 >> 3];
      *storage_ix = uVar19;
      *(ulong *)(storage + (uVar19 >> 3)) =
           uVar24 - 0x1842 << ((byte)uVar19 & 7) | (ulong)storage[uVar19 >> 3];
      *storage_ix = uVar26;
      puVar12 = local_440;
    }
    else {
      uVar26 = (ulong)cmd_depth[0x3f];
      uVar20 = *storage_ix;
      uVar19 = uVar20 + uVar26;
      uVar26 = uVar26 + uVar20 + 0x18;
      *(ulong *)(storage + (uVar20 >> 3)) =
           (ulong)cmd_bits[0x3f] << ((byte)uVar20 & 7) | (ulong)storage[uVar20 >> 3];
      *storage_ix = uVar19;
      *(ulong *)(storage + (uVar19 >> 3)) =
           uVar24 - 0x5842 << ((byte)uVar19 & 7) | (ulong)storage[uVar19 >> 3];
      *storage_ix = uVar26;
      puVar12 = local_440 + 1;
    }
  }
  *puVar12 = *puVar12 + 1;
  if (plVar28 != plVar29) {
    lVar25 = 0;
    do {
      bVar3 = local_338[*(byte *)((long)plVar29 + lVar25)];
      *(ulong *)(storage + (uVar26 >> 3)) =
           (ulong)local_238[*(byte *)((long)plVar29 + lVar25)] << ((byte)uVar26 & 7) |
           (ulong)storage[uVar26 >> 3];
      uVar26 = uVar26 + bVar3;
      *storage_ix = uVar26;
      lVar25 = lVar25 + 1;
    } while (uVar24 + (uVar24 == 0) != lVar25);
  }
  iVar22 = (int)((long)plVar28 - (long)puVar11);
  if (iVar23 == iVar22) {
    bVar3 = cmd_depth[0x40];
    *(ulong *)(storage + (uVar26 >> 3)) =
         (ulong)cmd_bits[0x40] << ((byte)uVar26 & 7) | (ulong)storage[uVar26 >> 3];
    uVar26 = bVar3 + uVar26;
    local_440[2] = local_440[2] + 1;
    iVar22 = iVar23;
  }
  else {
    uVar24 = (long)iVar22 + 3;
    uVar8 = 0x1f;
    if ((uint)uVar24 != 0) {
      for (; (uint)uVar24 >> uVar8 == 0; uVar8 = uVar8 - 1) {
      }
    }
    uVar7 = 0x1e - (uVar8 ^ 0x1f);
    uVar19 = (ulong)((uVar24 >> ((ulong)uVar7 & 0x3f) & 1) != 0);
    uVar20 = ((uVar8 ^ 0x1f) * 2 ^ 0x3e) - 4 | uVar19;
    bVar3 = cmd_depth[uVar20 + 0x50];
    *(ulong *)(storage + (uVar26 >> 3)) =
         (ulong)cmd_bits[uVar20 + 0x50] << ((byte)uVar26 & 7) | (ulong)storage[uVar26 >> 3];
    uVar26 = bVar3 + uVar26;
    *storage_ix = uVar26;
    *(ulong *)(storage + (uVar26 >> 3)) =
         uVar24 - (uVar19 + 2 << ((byte)uVar7 & 0x3f)) << ((byte)uVar26 & 7) |
         (ulong)storage[uVar26 >> 3];
    uVar26 = uVar26 + uVar7;
    aiStack_3f8[uVar20] = aiStack_3f8[uVar20] + 1;
  }
  uVar24 = uVar15 + 5;
  *storage_ix = uVar26;
  bVar3 = (byte)uVar26;
  if (uVar24 < 0xc) {
    bVar4 = cmd_depth[uVar15 + 1];
    *(ulong *)(storage + (uVar26 >> 3)) =
         (ulong)cmd_bits[uVar15 + 1] << (bVar3 & 7) | (ulong)storage[uVar26 >> 3];
    *storage_ix = bVar4 + uVar26;
    puVar12 = local_538 + uVar15 + 1;
  }
  else if (uVar24 < 0x48) {
    uVar24 = uVar15 - 3;
    uVar8 = 0x1f;
    if ((uint)uVar24 != 0) {
      for (; (uint)uVar24 >> uVar8 == 0; uVar8 = uVar8 - 1) {
      }
    }
    uVar8 = (uVar8 ^ 0xffffffe0) + 0x1f;
    uVar19 = uVar24 >> ((byte)uVar8 & 0x3f);
    lVar25 = uVar19 + (ulong)uVar8 * 2;
    bVar4 = cmd_depth[lVar25 + 4];
    *(ulong *)(storage + (uVar26 >> 3)) =
         (ulong)cmd_bits[lVar25 + 4] << (bVar3 & 7) | (ulong)storage[uVar26 >> 3];
    uVar26 = bVar4 + uVar26;
    *storage_ix = uVar26;
    *(ulong *)(storage + (uVar26 >> 3)) =
         uVar24 - (uVar19 << ((byte)uVar8 & 0x3f)) << ((byte)uVar26 & 7) |
         (ulong)storage[uVar26 >> 3];
    *storage_ix = uVar26 + uVar8;
    puVar12 = local_538 + lVar25 + 4;
  }
  else if (uVar24 < 0x88) {
    uVar19 = uVar15 - 3 >> 5;
    bVar4 = cmd_depth[uVar19 + 0x1e];
    *(ulong *)(storage + (uVar26 >> 3)) =
         (ulong)cmd_bits[uVar19 + 0x1e] << (bVar3 & 7) | (ulong)storage[uVar26 >> 3];
    uVar24 = uVar26 + bVar4;
    *storage_ix = uVar24;
    *(ulong *)(storage + (uVar24 >> 3)) =
         (ulong)((uint)(uVar15 - 3) & 0x1f) << ((byte)uVar24 & 7) | (ulong)storage[uVar24 >> 3];
    uVar20 = uVar26 + bVar4 + 5;
    *storage_ix = uVar20;
    bVar3 = cmd_depth[0x40];
    *(ulong *)(storage + (uVar20 >> 3)) =
         (ulong)cmd_bits[0x40] << ((byte)uVar20 & 7) | (ulong)storage[uVar20 >> 3];
    *storage_ix = bVar3 + uVar24 + 5;
    aiStack_4c0[uVar19] = aiStack_4c0[uVar19] + 1;
    puVar12 = local_440 + 2;
  }
  else {
    if (uVar24 < 0x848) {
      uVar7 = (int)uVar15 - 0x43;
      uVar8 = 0x1f;
      if (uVar7 != 0) {
        for (; uVar7 >> uVar8 == 0; uVar8 = uVar8 - 1) {
        }
      }
      lVar25 = 0x3b - (ulong)(uVar8 ^ 0x1f);
      bVar4 = cmd_depth[lVar25];
      *(ulong *)(storage + (uVar26 >> 3)) =
           (ulong)cmd_bits[lVar25] << (bVar3 & 7) | (ulong)storage[uVar26 >> 3];
      uVar26 = bVar4 + uVar26;
      *storage_ix = uVar26;
      uVar24 = uVar8 + uVar26;
      *(ulong *)(storage + (uVar26 >> 3)) =
           (-1L << ((byte)uVar8 & 0x3f)) + uVar15 + -0x43 << ((byte)uVar26 & 7) |
           (ulong)storage[uVar26 >> 3];
      *storage_ix = uVar24;
      bVar3 = cmd_depth[0x40];
      *(ulong *)(storage + (uVar24 >> 3)) =
           (ulong)cmd_bits[0x40] << ((byte)uVar24 & 7) | (ulong)storage[uVar24 >> 3];
      *storage_ix = bVar3 + uVar24;
      local_538[lVar25] = local_538[lVar25] + 1;
    }
    else {
      bVar4 = cmd_depth[0x27];
      *(ulong *)(storage + (uVar26 >> 3)) =
           (ulong)cmd_bits[0x27] << (bVar3 & 7) | (ulong)storage[uVar26 >> 3];
      uVar24 = uVar26 + bVar4;
      *storage_ix = uVar24;
      bVar14 = (byte)uVar24 & 7;
      *(ulong *)(storage + (uVar24 >> 3)) = uVar15 - 0x843 << bVar14 | (ulong)storage[uVar24 >> 3];
      uVar19 = bVar4 + uVar26 + 0x18;
      *storage_ix = uVar19;
      bVar3 = cmd_depth[0x40];
      uVar19 = uVar19 >> 3;
      *(ulong *)(storage + uVar19) = (ulong)cmd_bits[0x40] << bVar14 | (ulong)storage[uVar19];
      *storage_ix = bVar3 + uVar24 + 0x18;
      local_49c = local_49c + 1;
    }
    puVar12 = local_440 + 2;
  }
  plVar29 = (long *)((long)plVar28 + uVar15 + 5);
  *puVar12 = *puVar12 + 1;
  if (plVar17 <= plVar29) goto LAB_00131d13;
  uVar24 = *(ulong *)((long)plVar28 + uVar15 + 2);
  uVar19 = (uVar24 >> 0x18) * 0x1e35a7bd000000 >> 0x35;
  iVar23 = (int)plVar29 - iVar30;
  table[uVar24 * 0x1e35a7bd000000 >> 0x35] = iVar23 + -3;
  table[(uVar24 >> 8) * 0x1e35a7bd000000 >> 0x35] = iVar23 + -2;
  table[(uVar24 >> 0x10) * 0x1e35a7bd000000 >> 0x35] = iVar23 + -1;
  iVar5 = table[uVar19];
  table[uVar19] = iVar23;
  iVar23 = iVar22;
  if (((int)*plVar29 == *(int *)(input + iVar5)) &&
     (puVar11 = input + iVar5, plVar10 = plVar29,
     *(uint8_t *)((long)plVar28 + uVar15 + 9) == puVar11[4])) {
    do {
      puVar2 = (uint8_t *)((long)plVar10 + 5);
      puVar18 = (uint8_t *)((long)data + (-5 - (long)plVar10));
      if ((uint8_t *)0x7 < puVar18) {
        uVar24 = (ulong)puVar18 & 0xfffffffffffffff8;
        puVar21 = puVar2 + uVar24;
        lVar25 = 0;
        uVar15 = 0;
LAB_0013179a:
        if (*(ulong *)(puVar2 + uVar15 * 8) == *(ulong *)(puVar11 + uVar15 * 8 + 5))
        goto code_r0x001317a8;
        uVar15 = *(ulong *)(puVar11 + uVar15 * 8 + 5) ^ *(ulong *)(puVar2 + uVar15 * 8);
        uVar24 = 0;
        if (uVar15 != 0) {
          for (; (uVar15 >> uVar24 & 1) == 0; uVar24 = uVar24 + 1) {
          }
        }
        uVar15 = (uVar24 >> 3 & 0x1fffffff) - lVar25;
        goto LAB_001317fd;
      }
      uVar24 = 0;
      puVar21 = puVar2;
LAB_00131b52:
      uVar19 = (ulong)puVar18 & 7;
      uVar15 = uVar24;
      if (uVar19 != 0) {
        uVar20 = uVar24 | uVar19;
        do {
          uVar15 = uVar24;
          if (puVar11[uVar24 + 5] != *puVar21) break;
          puVar21 = puVar21 + 1;
          uVar24 = uVar24 + 1;
          uVar19 = uVar19 - 1;
          uVar15 = uVar20;
        } while (uVar19 != 0);
      }
LAB_001317fd:
      plVar29 = plVar10;
      iVar23 = iVar22;
      if (0x3fff0 < (long)plVar10 - (long)puVar11) break;
      uVar24 = uVar15 + 5;
      if (uVar24 < 10) {
        uVar24 = *storage_ix;
        uVar19 = cmd_depth[uVar15 + 0x13] + uVar24;
        *(ulong *)(storage + (uVar24 >> 3)) =
             (ulong)cmd_bits[uVar15 + 0x13] << ((byte)uVar24 & 7) | (ulong)storage[uVar24 >> 3];
        *storage_ix = uVar19;
        puVar12 = auStack_4ec + uVar15;
      }
      else if (uVar24 < 0x86) {
        uVar24 = uVar15 - 1;
        uVar8 = 0x1f;
        if ((uint)uVar24 != 0) {
          for (; (uint)uVar24 >> uVar8 == 0; uVar8 = uVar8 - 1) {
          }
        }
        uVar8 = (uVar8 ^ 0xffffffe0) + 0x1f;
        uVar26 = uVar24 >> ((byte)uVar8 & 0x3f);
        lVar25 = uVar26 + (ulong)uVar8 * 2;
        uVar20 = *storage_ix;
        uVar19 = cmd_depth[lVar25 + 0x14] + uVar20;
        *(ulong *)(storage + (uVar20 >> 3)) =
             (ulong)cmd_bits[lVar25 + 0x14] << ((byte)uVar20 & 7) | (ulong)storage[uVar20 >> 3];
        *storage_ix = uVar19;
        *(ulong *)(storage + (uVar19 >> 3)) =
             uVar24 - (uVar26 << ((byte)uVar8 & 0x3f)) << ((byte)uVar19 & 7) |
             (ulong)storage[uVar19 >> 3];
        uVar19 = uVar19 + uVar8;
        *storage_ix = uVar19;
        puVar12 = auStack_4ec + lVar25 + 1;
      }
      else if (uVar24 < 0x846) {
        uVar7 = (int)uVar15 - 0x41;
        uVar8 = 0x1f;
        if (uVar7 != 0) {
          for (; uVar7 >> uVar8 == 0; uVar8 = uVar8 - 1) {
          }
        }
        lVar25 = 0x3b - (ulong)(uVar8 ^ 0x1f);
        uVar24 = *storage_ix;
        uVar20 = cmd_depth[lVar25] + uVar24;
        *(ulong *)(storage + (uVar24 >> 3)) =
             (ulong)cmd_bits[lVar25] << ((byte)uVar24 & 7) | (ulong)storage[uVar24 >> 3];
        *storage_ix = uVar20;
        uVar19 = uVar8 + uVar20;
        *(ulong *)(storage + (uVar20 >> 3)) =
             (-1L << ((byte)uVar8 & 0x3f)) + uVar15 + -0x41 << ((byte)uVar20 & 7) |
             (ulong)storage[uVar20 >> 3];
        *storage_ix = uVar19;
        puVar12 = local_538 + lVar25;
      }
      else {
        uVar20 = *storage_ix;
        uVar24 = uVar20 + cmd_depth[0x27];
        uVar19 = cmd_depth[0x27] + uVar20 + 0x18;
        *(ulong *)(storage + (uVar20 >> 3)) =
             (ulong)cmd_bits[0x27] << ((byte)uVar20 & 7) | (ulong)storage[uVar20 >> 3];
        *storage_ix = uVar24;
        *(ulong *)(storage + (uVar24 >> 3)) =
             uVar15 - 0x841 << ((byte)uVar24 & 7) | (ulong)storage[uVar24 >> 3];
        *storage_ix = uVar19;
        puVar12 = &local_49c;
      }
      *puVar12 = *puVar12 + 1;
      iVar22 = (int)((long)plVar10 - (long)puVar11);
      uVar24 = (long)iVar22 + 3;
      uVar8 = 0x1f;
      if ((uint)uVar24 != 0) {
        for (; (uint)uVar24 >> uVar8 == 0; uVar8 = uVar8 - 1) {
        }
      }
      uVar7 = 0x1e - (uVar8 ^ 0x1f);
      uVar20 = (ulong)((uVar24 >> ((ulong)uVar7 & 0x3f) & 1) != 0);
      uVar26 = ((uVar8 ^ 0x1f) * 2 ^ 0x3e) - 4 | uVar20;
      bVar3 = cmd_depth[uVar26 + 0x50];
      *(ulong *)(storage + (uVar19 >> 3)) =
           (ulong)cmd_bits[uVar26 + 0x50] << ((byte)uVar19 & 7) | (ulong)storage[uVar19 >> 3];
      uVar19 = bVar3 + uVar19;
      *storage_ix = uVar19;
      *(ulong *)(storage + (uVar19 >> 3)) =
           uVar24 - (uVar20 + 2 << ((byte)uVar7 & 0x3f)) << ((byte)uVar19 & 7) |
           (ulong)storage[uVar19 >> 3];
      plVar29 = (long *)((long)plVar10 + uVar15 + 5);
      *storage_ix = uVar19 + uVar7;
      aiStack_3f8[uVar26] = aiStack_3f8[uVar26] + 1;
      if (plVar17 <= plVar29) goto LAB_00131d13;
      uVar24 = *(ulong *)((long)plVar10 + uVar15 + 2);
      uVar19 = (uVar24 >> 0x18) * 0x1e35a7bd000000 >> 0x35;
      iVar23 = (int)plVar29 - iVar30;
      table[uVar24 * 0x1e35a7bd000000 >> 0x35] = iVar23 + -3;
      table[(uVar24 >> 8) * 0x1e35a7bd000000 >> 0x35] = iVar23 + -2;
      table[(uVar24 >> 0x10) * 0x1e35a7bd000000 >> 0x35] = iVar23 + -1;
      iVar5 = table[uVar19];
      table[uVar19] = iVar23;
      iVar23 = iVar22;
      if (((int)*plVar29 != *(int *)(input + iVar5)) ||
         (puVar11 = input + iVar5, puVar2 = (uint8_t *)((long)plVar10 + uVar15 + 9),
         plVar10 = plVar29, *puVar2 != puVar11[4])) break;
    } while( true );
  }
  plVar10 = (long *)((long)plVar29 + 2);
  plVar28 = plVar29;
  if (plVar17 < plVar10) goto LAB_00131d13;
  goto LAB_00130e98;
code_r0x00130f86:
  uVar15 = uVar15 + 1;
  lVar25 = lVar25 + -8;
  if ((ulong)puVar18 >> 3 == uVar15) goto LAB_00131ba9;
  goto LAB_00130f78;
code_r0x001317a8:
  uVar15 = uVar15 + 1;
  lVar25 = lVar25 + -8;
  if ((ulong)puVar18 >> 3 == uVar15) goto LAB_00131b52;
  goto LAB_0013179a;
LAB_00131da6:
  plVar28 = data;
  if (plVar29 < data) {
    uVar24 = (long)data - (long)plVar29;
    if (uVar24 < 0x1842) {
      if (uVar24 < 6) {
        uVar19 = *storage_ix;
        uVar15 = cmd_depth[uVar24 + 0x28] + uVar19;
        *(ulong *)(storage + (uVar19 >> 3)) =
             (ulong)cmd_bits[uVar24 + 0x28] << ((byte)uVar19 & 7) | (ulong)storage[uVar19 >> 3];
        *storage_ix = uVar15;
        puVar12 = auStack_498 + uVar24;
      }
      else if (uVar24 < 0x82) {
        uVar19 = uVar24 - 2;
        uVar8 = 0x1f;
        if ((uint)uVar19 != 0) {
          for (; (uint)uVar19 >> uVar8 == 0; uVar8 = uVar8 - 1) {
          }
        }
        uVar8 = (uVar8 ^ 0xffffffe0) + 0x1f;
        uVar26 = uVar19 >> ((byte)uVar8 & 0x3f);
        lVar25 = uVar26 + (ulong)uVar8 * 2;
        uVar20 = *storage_ix;
        uVar15 = cmd_depth[lVar25 + 0x2a] + uVar20;
        *(ulong *)(storage + (uVar20 >> 3)) =
             (ulong)cmd_bits[lVar25 + 0x2a] << ((byte)uVar20 & 7) | (ulong)storage[uVar20 >> 3];
        *storage_ix = uVar15;
        *(ulong *)(storage + (uVar15 >> 3)) =
             uVar19 - (uVar26 << ((byte)uVar8 & 0x3f)) << ((byte)uVar15 & 7) |
             (ulong)storage[uVar15 >> 3];
        uVar15 = uVar15 + uVar8;
        *storage_ix = uVar15;
        puVar12 = auStack_498 + lVar25 + 2;
      }
      else if (uVar24 < 0x842) {
        uVar7 = (int)uVar24 - 0x42;
        uVar8 = 0x1f;
        if (uVar7 != 0) {
          for (; uVar7 >> uVar8 == 0; uVar8 = uVar8 - 1) {
          }
        }
        lVar25 = 0x51 - (ulong)(uVar8 ^ 0x1f);
        uVar15 = *storage_ix;
        uVar19 = cmd_depth[lVar25] + uVar15;
        *(ulong *)(storage + (uVar15 >> 3)) =
             (ulong)cmd_bits[lVar25] << ((byte)uVar15 & 7) | (ulong)storage[uVar15 >> 3];
        *storage_ix = uVar19;
        uVar15 = uVar8 + uVar19;
        *(ulong *)(storage + (uVar19 >> 3)) =
             (-1L << ((byte)uVar8 & 0x3f)) + uVar24 + -0x42 << ((byte)uVar19 & 7) |
             (ulong)storage[uVar19 >> 3];
        *storage_ix = uVar15;
        puVar12 = local_538 + lVar25;
      }
      else {
        uVar20 = *storage_ix;
        uVar19 = uVar20 + cmd_depth[0x3d];
        uVar15 = cmd_depth[0x3d] + uVar20 + 0xc;
        *(ulong *)(storage + (uVar20 >> 3)) =
             (ulong)cmd_bits[0x3d] << ((byte)uVar20 & 7) | (ulong)storage[uVar20 >> 3];
        *storage_ix = uVar19;
        *(ulong *)(storage + (uVar19 >> 3)) =
             uVar24 - 0x842 << ((byte)uVar19 & 7) | (ulong)storage[uVar19 >> 3];
        *storage_ix = uVar15;
        puVar12 = &local_444;
      }
      *puVar12 = *puVar12 + 1;
      lVar25 = 0;
      do {
        bVar3 = local_338[*(byte *)((long)plVar29 + lVar25)];
        *(ulong *)(storage + (uVar15 >> 3)) =
             (ulong)local_238[*(byte *)((long)plVar29 + lVar25)] << ((byte)uVar15 & 7) |
             (ulong)storage[uVar15 >> 3];
        uVar15 = uVar15 + bVar3;
        *storage_ix = uVar15;
        lVar25 = lVar25 + 1;
      } while (uVar24 + (uVar24 == 0) != lVar25);
    }
    else {
      uVar15 = ((long)plVar29 - (long)begin) * 0x32;
      if ((uVar15 < uVar24 || uVar15 - uVar24 == 0) && (0x3d4 < local_590)) {
        EmitUncompressedMetaBlock
                  ((uint8_t *)begin,(uint8_t *)data,storage_ix_start,storage_ix,storage);
      }
      else {
        bVar32 = uVar24 < 0x5842;
        pbVar13 = cmd_depth + 0x3f;
        puVar6 = cmd_bits + 0x3f;
        if (bVar32) {
          pbVar13 = cmd_depth + 0x3e;
          puVar6 = cmd_bits + 0x3e;
        }
        bVar3 = *pbVar13;
        uVar15 = *storage_ix;
        lVar25 = uVar15 + 0x18;
        if (bVar32) {
          lVar25 = uVar15 + 0xe;
        }
        uVar19 = lVar25 + (ulong)bVar3;
        *(ulong *)(storage + (uVar15 >> 3)) =
             (ulong)*puVar6 << ((byte)uVar15 & 7) | (ulong)storage[uVar15 >> 3];
        uVar15 = uVar15 + bVar3;
        *storage_ix = uVar15;
        *(ulong *)(storage + (uVar15 >> 3)) =
             ((ulong)bVar32 << 0xe | 0xffffffffffffa7be) + uVar24 << ((byte)uVar15 & 7) |
             (ulong)storage[uVar15 >> 3];
        local_440[!bVar32] = local_440[!bVar32] + 1;
        *storage_ix = uVar19;
        uVar15 = 0;
        do {
          bVar3 = local_338[*(byte *)((long)plVar29 + uVar15)];
          *(ulong *)(storage + (uVar19 >> 3)) =
               (ulong)local_238[*(byte *)((long)plVar29 + uVar15)] << ((byte)uVar19 & 7) |
               (ulong)storage[uVar19 >> 3];
          uVar19 = uVar19 + bVar3;
          *storage_ix = uVar19;
          uVar15 = uVar15 + 1;
        } while (uVar24 != uVar15);
      }
    }
  }
LAB_0013203e:
  begin = plVar28;
  if (local_5b0 == (Elf64_Ehdr *)0x0) {
    if (is_last == 0) {
      *cmd_code = '\0';
      *cmd_code_numbits = 0;
      BuildAndStoreCommandPrefixCode(local_538,cmd_depth,cmd_bits,cmd_code_numbits,cmd_code);
    }
    return;
  }
  local_5a8 = (Elf64_Ehdr *)0x18000;
  if (local_5b0 < (Elf64_Ehdr *)0x18000) {
    local_5a8 = local_5b0;
  }
  storage_ix_start = *storage_ix;
  BrotliStoreMetaBlockHeader((size_t)local_5a8,0,storage_ix,storage);
  uVar24 = *storage_ix;
  uVar15 = uVar24 >> 3;
  *(ulong *)(storage + uVar15) = (ulong)storage[uVar15];
  *storage_ix = uVar24 + 0xd;
  local_590 = BuildAndStoreLiteralPrefixCode
                        (m,(uint8_t *)begin,(size_t)local_5a8,local_338,local_238,storage_ix,storage
                        );
  BuildAndStoreCommandPrefixCode(local_538,cmd_depth,cmd_bits,storage_ix,storage);
  goto LAB_00130e01;
}

Assistant:

void BrotliCompressFragmentFast(
    MemoryManager* m, const uint8_t* input, size_t input_size,
    BROTLI_BOOL is_last, int* table, size_t table_size, uint8_t cmd_depth[128],
    uint16_t cmd_bits[128], size_t* cmd_code_numbits, uint8_t* cmd_code,
    size_t* storage_ix, uint8_t* storage) {
  const size_t initial_storage_ix = *storage_ix;
  const size_t table_bits = Log2FloorNonZero(table_size);

  if (input_size == 0) {
    BROTLI_DCHECK(is_last);
    BrotliWriteBits(1, 1, storage_ix, storage);  /* islast */
    BrotliWriteBits(1, 1, storage_ix, storage);  /* isempty */
    *storage_ix = (*storage_ix + 7u) & ~7u;
    return;
  }

  switch (table_bits) {
#define CASE_(B)                                                     \
    case B:                                                          \
      BrotliCompressFragmentFastImpl ## B(                           \
          m, input, input_size, is_last, table, cmd_depth, cmd_bits, \
          cmd_code_numbits, cmd_code, storage_ix, storage);          \
      break;
    FOR_TABLE_BITS_(CASE_)
#undef CASE_
    default: BROTLI_DCHECK(0); break;
  }

  /* If output is larger than single uncompressed block, rewrite it. */
  if (*storage_ix - initial_storage_ix > 31 + (input_size << 3)) {
    EmitUncompressedMetaBlock(input, input + input_size, initial_storage_ix,
                              storage_ix, storage);
  }

  if (is_last) {
    BrotliWriteBits(1, 1, storage_ix, storage);  /* islast */
    BrotliWriteBits(1, 1, storage_ix, storage);  /* isempty */
    *storage_ix = (*storage_ix + 7u) & ~7u;
  }
}